

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__jpeg_decode_block_prog_ac(stbi__jpeg *j,short *data,stbi__huffman *hac,stbi__int16 *fac)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  ushort *puVar6;
  byte bVar7;
  short *p_1;
  ushort local_60;
  int rs_1;
  int s_1;
  int r_1;
  short *p;
  short bit;
  int rs;
  int s;
  int r;
  int c;
  uint zig;
  int shift;
  int k;
  stbi__int16 *fac_local;
  stbi__huffman *hac_local;
  short *data_local;
  stbi__jpeg *j_local;
  
  if (j->spec_start == 0) {
    j_local._4_4_ = stbi__err("can\'t merge dc and ac");
  }
  else {
    if (j->succ_high == 0) {
      iVar5 = j->succ_low;
      if (j->eob_run != 0) {
        j->eob_run = j->eob_run + -1;
        return 1;
      }
      zig = j->spec_start;
      do {
        if (j->code_bits < 0x10) {
          stbi__grow_buffer_unsafe(j);
        }
        uVar3 = (uint)fac[(int)(j->code_buffer >> 0x17)];
        bVar7 = (byte)iVar5;
        if (uVar3 == 0) {
          uVar3 = stbi__jpeg_huff_decode(j,hac);
          if ((int)uVar3 < 0) {
            iVar5 = stbi__err("bad huffman code");
            return iVar5;
          }
          iVar4 = (int)uVar3 >> 4;
          if ((uVar3 & 0xf) == 0) {
            if (iVar4 < 0xf) {
              j->eob_run = 1 << ((byte)iVar4 & 0x1f);
              if (iVar4 != 0) {
                iVar5 = stbi__jpeg_get_bits(j,iVar4);
                j->eob_run = iVar5 + j->eob_run;
              }
              j->eob_run = j->eob_run + -1;
              break;
            }
            zig = zig + 0x10;
          }
          else {
            iVar4 = iVar4 + zig;
            zig = iVar4 + 1;
            bVar1 = ""[iVar4];
            iVar4 = stbi__extend_receive(j,uVar3 & 0xf);
            data[bVar1] = (short)(iVar4 << (bVar7 & 0x1f));
          }
        }
        else {
          iVar4 = ((int)uVar3 >> 4 & 0xfU) + zig;
          j->code_buffer = j->code_buffer << (sbyte)(uVar3 & 0xf);
          j->code_bits = j->code_bits - (uVar3 & 0xf);
          zig = iVar4 + 1;
          data[""[iVar4]] = (short)(((int)uVar3 >> 8) << (bVar7 & 0x1f));
        }
      } while ((int)zig <= j->spec_end);
    }
    else {
      uVar2 = (ushort)(1 << ((byte)j->succ_low & 0x1f));
      if (j->eob_run == 0) {
        zig = j->spec_start;
        do {
          uVar3 = stbi__jpeg_huff_decode(j,hac);
          if ((int)uVar3 < 0) {
            iVar5 = stbi__err("bad huffman code");
            return iVar5;
          }
          rs_1 = (int)uVar3 >> 4;
          if ((uVar3 & 0xf) == 0) {
            if (rs_1 < 0xf) {
              j->eob_run = (1 << ((byte)rs_1 & 0x1f)) + -1;
              if (rs_1 != 0) {
                iVar5 = stbi__jpeg_get_bits(j,rs_1);
                j->eob_run = iVar5 + j->eob_run;
              }
              rs_1 = 0x40;
            }
            local_60 = 0;
          }
          else {
            if ((uVar3 & 0xf) != 1) {
              iVar5 = stbi__err("bad huffman code");
              return iVar5;
            }
            iVar5 = stbi__jpeg_get_bit(j);
            local_60 = uVar2;
            if (iVar5 == 0) {
              local_60 = -uVar2;
            }
          }
          while ((int)zig <= j->spec_end) {
            uVar3 = zig + 1;
            puVar6 = (ushort *)(data + ""[(int)zig]);
            zig = uVar3;
            if (*puVar6 == 0) {
              if (rs_1 == 0) {
                *puVar6 = local_60;
                break;
              }
              rs_1 = rs_1 + -1;
            }
            else {
              iVar5 = stbi__jpeg_get_bit(j);
              if ((iVar5 != 0) && ((*puVar6 & uVar2) == 0)) {
                if ((short)*puVar6 < 1) {
                  *puVar6 = *puVar6 - uVar2;
                }
                else {
                  *puVar6 = *puVar6 + uVar2;
                }
              }
            }
          }
        } while ((int)zig <= j->spec_end);
      }
      else {
        j->eob_run = j->eob_run + -1;
        for (zig = j->spec_start; (int)zig <= j->spec_end; zig = zig + 1) {
          puVar6 = (ushort *)(data + ""[(int)zig]);
          if (((*puVar6 != 0) && (iVar5 = stbi__jpeg_get_bit(j), iVar5 != 0)) &&
             ((*puVar6 & uVar2) == 0)) {
            if ((short)*puVar6 < 1) {
              *puVar6 = *puVar6 - uVar2;
            }
            else {
              *puVar6 = *puVar6 + uVar2;
            }
          }
        }
      }
    }
    j_local._4_4_ = 1;
  }
  return j_local._4_4_;
}

Assistant:

static int stbi__jpeg_decode_block_prog_ac(stbi__jpeg *j, short data[64], stbi__huffman *hac, stbi__int16 *fac)
{
    int k;
    if (j->spec_start == 0) return stbi__err("can't merge dc and ac", "Corrupt JPEG");

    if (j->succ_high == 0)
    {
        int shift = j->succ_low;

        if (j->eob_run)
        {
            --j->eob_run;
            return 1;
        }

        k = j->spec_start;
        do
        {
            unsigned int zig;
            int c, r, s;
            if (j->code_bits < 16) stbi__grow_buffer_unsafe(j);
            c = (j->code_buffer >> (32 - FAST_BITS)) & ((1 << FAST_BITS) - 1);
            r = fac[c];
            if (r)
            { // fast-AC path
                k += (r >> 4) & 15; // run
                s = r & 15; // combined length
                j->code_buffer <<= s;
                j->code_bits -= s;
                zig = stbi__jpeg_dezigzag[k++];
                data[zig] = (short) ((r >> 8) << shift);
            } else
            {
                int rs = stbi__jpeg_huff_decode(j, hac);
                if (rs < 0) return stbi__err("bad huffman code", "Corrupt JPEG");
                s = rs & 15;
                r = rs >> 4;
                if (s == 0)
                {
                    if (r < 15)
                    {
                        j->eob_run = (1 << r);
                        if (r)
                            j->eob_run += stbi__jpeg_get_bits(j, r);
                        --j->eob_run;
                        break;
                    }
                    k += 16;
                } else
                {
                    k += r;
                    zig = stbi__jpeg_dezigzag[k++];
                    data[zig] = (short) (stbi__extend_receive(j, s) << shift);
                }
            }
        } while (k <= j->spec_end);
    } else
    {
        // refinement scan for these AC coefficients

        short bit = (short) (1 << j->succ_low);

        if (j->eob_run)
        {
            --j->eob_run;
            for (k = j->spec_start; k <= j->spec_end; ++k)
            {
                short *p = &data[stbi__jpeg_dezigzag[k]];
                if (*p != 0)
                    if (stbi__jpeg_get_bit(j))
                        if ((*p & bit) == 0)
                        {
                            if (*p > 0)
                                *p += bit;
                            else
                                *p -= bit;
                        }
            }
        } else
        {
            k = j->spec_start;
            do
            {
                int r, s;
                int rs = stbi__jpeg_huff_decode(j,
                                                hac); // @OPTIMIZE see if we can use the fast path here, advance-by-r is so slow, eh
                if (rs < 0) return stbi__err("bad huffman code", "Corrupt JPEG");
                s = rs & 15;
                r = rs >> 4;
                if (s == 0)
                {
                    if (r < 15)
                    {
                        j->eob_run = (1 << r) - 1;
                        if (r)
                            j->eob_run += stbi__jpeg_get_bits(j, r);
                        r = 64; // force end of block
                    } else
                    {
                        // r=15 s=0 should write 16 0s, so we just do
                        // a run of 15 0s and then write s (which is 0),
                        // so we don't have to do anything special here
                    }
                } else
                {
                    if (s != 1) return stbi__err("bad huffman code", "Corrupt JPEG");
                    // sign bit
                    if (stbi__jpeg_get_bit(j))
                        s = bit;
                    else
                        s = -bit;
                }

                // advance by r
                while (k <= j->spec_end)
                {
                    short *p = &data[stbi__jpeg_dezigzag[k++]];
                    if (*p != 0)
                    {
                        if (stbi__jpeg_get_bit(j))
                            if ((*p & bit) == 0)
                            {
                                if (*p > 0)
                                    *p += bit;
                                else
                                    *p -= bit;
                            }
                    } else
                    {
                        if (r == 0)
                        {
                            *p = (short) s;
                            break;
                        }
                        --r;
                    }
                }
            } while (k <= j->spec_end);
        }
    }
    return 1;
}